

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O1

void __thiscall
BamTools::ResolveTool::ReadNamesFileWriter::Write
          (ReadNamesFileWriter *this,string *readGroupName,string *readName)

{
  ostream *poVar1;
  char local_9;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(readGroupName->_M_dataplus)._M_p,
                      readGroupName->_M_string_length);
  local_9 = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_9,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(readName->_M_dataplus)._M_p,readName->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ResolveTool::ReadNamesFileWriter::Write(const std::string& readGroupName,
                                             const std::string& readName)
{
    m_stream << readGroupName << TAB_CHAR << readName << std::endl;
}